

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::EHBailoutPatchUp(Lowerer *this)

{
  IRKind IVar1;
  Instr *pIVar2;
  Region *region;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *restoreLabel;
  BailOutInfo *pBVar6;
  Region *pRVar7;
  Instr *this_00;
  LabelInstr *local_38;
  
  if ((this->m_func->field_0x243 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x57df,"(this->m_func->isPostLayout)","this->m_func->isPostLayout");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  restoreLabel = IR::LabelInstr::New(Label,this->m_func,false);
  local_38 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  IVar1 = (local_38->super_Instr).m_kind;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    local_38 = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,&local_38->super_Instr);
  }
  this_00 = this->m_func->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    bVar4 = false;
    do {
      pIVar2 = this_00->m_next;
      if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
        this->currentRegion = (Region *)this_00[1].m_src2;
      }
      region = this->currentRegion;
      if ((region != (Region *)0x0) && ((byte)(region->type - RegionTypeTry) < 3)) {
        if ((region->type == RegionTypeFinally) &&
           (pRVar7 = region, region->matchingTryRegion->matchingFinallyOnNoExceptRegion == region))
        {
          do {
            pRVar7 = pRVar7->parent;
            if (pRVar7->type != RegionTypeFinally) {
              if (pRVar7->type == RegionTypeRoot) goto LAB_005ed873;
              break;
            }
          } while (pRVar7->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar7);
        }
        InsertReturnThunkForRegion(this,region,restoreLabel);
        if ((this_00->field_0x38 & 0x10) != 0) {
          pBVar6 = IR::Instr::GetBailOutInfo(this_00);
          if (pBVar6->bailOutFunc == this->m_func) {
            SetHasBailedOut(this,this_00);
          }
          EmitEHBailoutStackRestore(this,this_00);
          EmitSaveEHBailoutReturnValueAndJumpToRetThunk(this,this_00);
          if (!bVar4) {
            EmitRestoreReturnValueFromEHBailout(this,restoreLabel,local_38);
            bVar4 = true;
          }
        }
      }
LAB_005ed873:
      this_00 = pIVar2;
    } while (pIVar2 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
Lowerer::EHBailoutPatchUp()
{
    Assert(this->m_func->isPostLayout);
    // 1. Insert return thunks for all the regions.
    // 2. Set the hasBailedOut bit to true on all bailout paths in EH regions.
    // 3. Insert code after every bailout in a try or catch region to save the return value on the stack, and jump to the return thunk (See Region.h) of that region.
    // 4. Insert code right before the epilog, to restore the return value (saved in 2.) from a bailout into eax.

    IR::LabelInstr * restoreReturnValueFromBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    IR::LabelInstr * epilogLabel;
    IR::Instr * exitPrevInstr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (exitPrevInstr->IsLabelInstr())
    {
        epilogLabel = exitPrevInstr->AsLabelInstr();
    }
    else
    {
        epilogLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(epilogLabel);
    }

    IR::Instr * tmpInstr = nullptr;
    bool restoreReturnFromBailoutEmitted = false;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->m_func)
    {
        if (instr->IsLabelInstr())
        {
            this->currentRegion = instr->AsLabelInstr()->GetRegion();
        }

        // Consider (radua): Assert(this->currentRegion) here?
        if (this->currentRegion)
        {
            RegionType currentRegionType = this->currentRegion->GetType();
            if (currentRegionType == RegionTypeTry || currentRegionType == RegionTypeCatch || currentRegionType == RegionTypeFinally)
            {
                if (this->currentRegion->IsNonExceptingFinally())
                {
                    Region * parent = this->currentRegion->GetParent();

                    while (parent->IsNonExceptingFinally())
                    {
                        parent = parent->GetParent();
                    }
                    if (parent->GetType() == RegionTypeRoot)
                    {
                        continue;
                    }
                }
                this->InsertReturnThunkForRegion(this->currentRegion, restoreReturnValueFromBailoutLabel);
                if (instr->HasBailOutInfo())
                {
                    if (instr->GetBailOutInfo()->bailOutFunc == this->m_func)
                    {
                        // We dont set this bit for inlined code, if there was a bailout in the inlined code,
                        // and an exception was thrown, we want the caller's handler to handle the exception accordingly.
                        // TODO : Revisit when we start inlining functions with try-catch/try-finally
                        this->SetHasBailedOut(instr);
                    }
                    tmpInstr = this->EmitEHBailoutStackRestore(instr);
                    this->EmitSaveEHBailoutReturnValueAndJumpToRetThunk(tmpInstr);
                    if (!restoreReturnFromBailoutEmitted)
                    {
                        this->EmitRestoreReturnValueFromEHBailout(restoreReturnValueFromBailoutLabel, epilogLabel);
                        restoreReturnFromBailoutEmitted = true;
                    }
                }
            }
        }
    }
    NEXT_INSTR_IN_FUNC_EDITING
}